

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O2

SegmentBTreeRoot * __thiscall Js::JavascriptArray::BuildSegmentMap(JavascriptArray *this)

{
  code *pcVar1;
  bool bVar2;
  Recycler *this_00;
  Recycler *alloc;
  SegmentBTreeRoot *segmentMap;
  undefined4 *puVar3;
  uint uVar4;
  SparseArraySegmentBase *newSeg;
  undefined1 local_60 [8];
  TrackAllocData data;
  
  this_00 = RecyclableObject::GetRecycler((RecyclableObject *)this);
  local_60 = (undefined1  [8])&SegmentBTreeRoot::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_693dcf2;
  data.filename._0_4_ = 0xa6a;
  alloc = Memory::Recycler::TrackAllocInfo(this_00,(TrackAllocData *)local_60);
  uVar4 = 0;
  segmentMap = (SegmentBTreeRoot *)new<Memory::Recycler>(0x28,alloc,0x37ff80);
  (segmentMap->super_SegmentBTree).keys.ptr = (uint *)0x0;
  (segmentMap->super_SegmentBTree).segments.ptr = (SparseArraySegmentBase **)0x0;
  *(undefined8 *)((long)&(segmentMap->super_SegmentBTree).segments.ptr + 4) = 0;
  *(undefined8 *)((long)&(segmentMap->super_SegmentBTree).children.ptr + 4) = 0;
  (segmentMap->lastUsedSegment).ptr = (SparseArraySegmentBase *)0x0;
  newSeg = (this->head).ptr;
  if (newSeg != (SparseArraySegmentBase *)0x0) {
    uVar4 = newSeg->left;
  }
  data._32_8_ = this;
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  do {
    if (newSeg == (SparseArraySegmentBase *)0x0) {
      SetSegmentMap((JavascriptArray *)data._32_8_,segmentMap);
      return segmentMap;
    }
    if (newSeg->left < uVar4) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptArray.inl"
                                  ,0x35,"(current->left >= lastindex)","current->left >= lastindex")
      ;
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
    SegmentBTreeRoot::Add(segmentMap,this_00,newSeg);
    uVar4 = newSeg->length + newSeg->left;
    newSeg = (newSeg->next).ptr;
  } while( true );
}

Assistant:

SegmentBTreeRoot * JavascriptArray::BuildSegmentMap()
    {
        Recycler* recycler = GetRecycler();
        SegmentBTreeRoot* tmpSegmentMap = AllocatorNewStruct(Recycler, recycler, SegmentBTreeRoot);
        ForEachSegment([recycler, tmpSegmentMap](SparseArraySegmentBase * current)
        {
            tmpSegmentMap->Add(recycler, current);
            return false;
        });

        // There could be OOM during building segment map. Save to array only after its successful completion.
        SetSegmentMap(tmpSegmentMap);
        return tmpSegmentMap;
    }